

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void scbitrevR2(float *ioptr,long M,short *BRLow,float scale)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  lVar18 = 1L << (M & 0x3fU);
  lVar17 = 1L << ((M + 3) / 2 & 0x3fU);
  uVar11 = ~(-1L << ((ulong)((int)(M / 2) - 1) & 0x3f));
  lVar13 = 1L << ((ulong)(byte)((char)(M / 2) + 1) & 0x3f);
  pfVar1 = ioptr + lVar17;
  pfVar22 = ioptr + (lVar18 * 2 - lVar17);
  pfVar12 = ioptr + (lVar18 - lVar17);
  for (; uVar23 = uVar11, ioptr < pfVar1; ioptr = ioptr + lVar13) {
    while (-1 < (long)uVar23) {
      lVar20 = (long)((int)BRLow[uVar23] << 2);
      lVar14 = uVar23 << ((M + 1) / 2 + 1U & 0x3f);
      pfVar16 = pfVar12;
      uVar19 = uVar11;
      pfVar21 = pfVar22;
      while( true ) {
        uVar3 = *(ulong *)(pfVar16 + lVar20);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar3;
        uVar4 = *(ulong *)(pfVar21 + lVar20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar4;
        auVar29._0_4_ = (float)uVar4 + (float)uVar3;
        auVar29._4_4_ = (float)(uVar4 >> 0x20) + (float)(uVar3 >> 0x20);
        auVar29._8_8_ = 0;
        if ((long)uVar19 <= (long)uVar23) break;
        lVar15 = (long)BRLow[uVar19];
        auVar24 = vsubps_avx(auVar24,auVar26);
        uVar5 = *(undefined8 *)(pfVar16 + lVar20 + 2);
        auVar27._8_8_ = uVar5;
        auVar27._0_8_ = uVar5;
        uVar6 = *(undefined8 *)(pfVar21 + lVar20 + 2);
        auVar35._8_8_ = uVar6;
        auVar35._0_8_ = uVar6;
        uVar19 = uVar19 - 1;
        auVar24 = vmovlhps_avx(auVar29,auVar24);
        uVar7 = *(undefined8 *)(ioptr + lVar14 + lVar15 * 4);
        auVar30._8_8_ = uVar7;
        auVar30._0_8_ = uVar7;
        uVar8 = *(undefined8 *)(ioptr + lVar14 + lVar15 * 4 + 2);
        auVar33._8_8_ = uVar8;
        auVar33._0_8_ = uVar8;
        uVar9 = *(undefined8 *)(ioptr + lVar14 + lVar15 * 4 + lVar18);
        auVar32._8_8_ = uVar9;
        auVar32._0_8_ = uVar9;
        uVar10 = *(undefined8 *)(ioptr + lVar14 + lVar15 * 4 + lVar18 + 2);
        auVar34._8_8_ = uVar10;
        auVar34._0_8_ = uVar10;
        pfVar2 = ioptr + lVar14 + lVar15 * 4;
        *pfVar2 = auVar24._0_4_ * scale;
        pfVar2[1] = auVar24._4_4_ * scale;
        pfVar2[2] = auVar24._8_4_ * scale;
        pfVar2[3] = auVar24._12_4_ * scale;
        auVar24 = vsubps_avx(auVar27,auVar35);
        pfVar2 = ioptr + lVar14 + lVar15 * 4 + lVar18;
        *pfVar2 = ((float)uVar6 + (float)uVar5) * scale;
        pfVar2[1] = ((float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20)) * scale;
        pfVar2[2] = auVar24._8_4_ * scale;
        pfVar2[3] = auVar24._12_4_ * scale;
        auVar24 = vsubps_avx(auVar30,auVar32);
        auVar26 = vsubps_avx(auVar33,auVar34);
        pfVar2 = pfVar16 + lVar20;
        *pfVar2 = ((float)uVar9 + (float)uVar7) * scale;
        pfVar2[1] = ((float)((ulong)uVar9 >> 0x20) + (float)((ulong)uVar7 >> 0x20)) * scale;
        pfVar2[2] = auVar24._8_4_ * scale;
        pfVar2[3] = auVar24._12_4_ * scale;
        pfVar16 = pfVar16 + -lVar17;
        pfVar2 = pfVar21 + lVar20;
        *pfVar2 = ((float)uVar10 + (float)uVar8) * scale;
        pfVar2[1] = ((float)((ulong)uVar10 >> 0x20) + (float)((ulong)uVar8 >> 0x20)) * scale;
        pfVar2[2] = auVar26._8_4_ * scale;
        pfVar2[3] = auVar26._12_4_ * scale;
        pfVar21 = pfVar21 + -lVar17;
      }
      auVar24 = vsubps_avx(auVar24,auVar26);
      uVar5 = *(undefined8 *)(pfVar16 + lVar20 + 2);
      auVar28._8_8_ = uVar5;
      auVar28._0_8_ = uVar5;
      uVar6 = *(undefined8 *)(pfVar21 + lVar20 + 2);
      auVar31._8_8_ = uVar6;
      auVar31._0_8_ = uVar6;
      auVar24 = vmovlhps_avx(auVar29,auVar24);
      pfVar16 = pfVar16 + lVar20;
      *pfVar16 = auVar24._0_4_ * scale;
      pfVar16[1] = auVar24._4_4_ * scale;
      pfVar16[2] = auVar24._8_4_ * scale;
      pfVar16[3] = auVar24._12_4_ * scale;
      auVar24 = vsubps_avx(auVar28,auVar31);
      auVar25._0_4_ = ((float)uVar6 + (float)uVar5) * scale;
      auVar25._4_4_ = ((float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20)) * scale;
      auVar25._8_4_ = auVar24._8_4_ * scale;
      auVar25._12_4_ = auVar24._12_4_ * scale;
      *(undefined1 (*) [16])(pfVar21 + lVar20) = auVar25;
      uVar23 = uVar23 - 1;
    }
    pfVar12 = pfVar12 + lVar13;
    pfVar22 = pfVar22 + lVar13;
  }
  return;
}

Assistant:

static inline void scbitrevR2(float *ioptr, long M, short *BRLow, float scale) {
/*** scaled bit reverse and first radix 2 stage forward or inverse fft ***/
float	f0r;
float	f0i;
float	f1r;
float	f1i;
float	f2r;
float	f2i;
float	f3r;
float	f3i;
float	f4r;
float	f4i;
float	f5r;
float	f5i;
float	f6r;
float	f6i;
float	f7r;
float	f7i;
float	t0r;
float	t0i;
float	t1r;
float	t1i;
float	*p0r;
float	*p1r;
float	*IOP;
float 	*iolimit;
long 	Colstart;
long 	iCol;
unsigned long 	posA;
unsigned long 	posAi;
unsigned long 	posB;
unsigned long 	posBi;

const unsigned long Nrems2 = POW2((M+3)/2);
const unsigned long Nroot_1_ColInc = POW2(M)-Nrems2;
const unsigned long Nroot_1 = POW2(M/2-1)-1;
const unsigned long ColstartShift = (M+1)/2 +1;
posA = POW2(M);		// 1/2 of POW2(M) complexes
posAi = posA + 1;
posB = posA + 2;
posBi = posB + 1;

iolimit = ioptr + Nrems2;
for (; ioptr < iolimit; ioptr += POW2(M/2+1)){
	for (Colstart = Nroot_1; Colstart >= 0; Colstart--){
		iCol = Nroot_1;
		p0r = ioptr+ Nroot_1_ColInc + BRLow[Colstart]*4;
		IOP = ioptr + (Colstart << ColstartShift);
		p1r = IOP + BRLow[iCol]*4;
		f0r = *(p0r);
		f0i = *(p0r+1);
		f1r = *(p0r+posA);
		f1i = *(p0r+posAi);
		for (; iCol > Colstart;){
			f2r = *(p0r+2);
			f2i = *(p0r+(2+1));
			f3r = *(p0r+posB);
			f3i = *(p0r+posBi);
			f4r = *(p1r);
			f4i = *(p1r+1);
			f5r = *(p1r+posA);
			f5i = *(p1r+posAi);
			f6r = *(p1r+2);
			f6i = *(p1r+(2+1));
			f7r = *(p1r+posB);
			f7i = *(p1r+posBi);
			
			t0r	= f0r + f1r;
			t0i	= f0i + f1i;
			f1r = f0r - f1r;
			f1i = f0i - f1i;
			t1r = f2r + f3r;
			t1i = f2i + f3i;
			f3r = f2r - f3r;
			f3i = f2i - f3i;
			f0r = f4r + f5r;
			f0i = f4i + f5i;
			f5r = f4r - f5r;
			f5i = f4i - f5i;
			f2r = f6r + f7r;
			f2i = f6i + f7i;
			f7r = f6r - f7r;
			f7i = f6i - f7i;

			*(p1r) = scale*t0r;
			*(p1r+1) = scale*t0i;
			*(p1r+2) = scale*f1r;
			*(p1r+(2+1)) = scale*f1i;
			*(p1r+posA) = scale*t1r;
			*(p1r+posAi) = scale*t1i;
			*(p1r+posB) = scale*f3r;
			*(p1r+posBi) = scale*f3i;
			*(p0r) = scale*f0r;
			*(p0r+1) = scale*f0i;
			*(p0r+2) = scale*f5r;
			*(p0r+(2+1)) = scale*f5i;
			*(p0r+posA) = scale*f2r;
			*(p0r+posAi) = scale*f2i;
			*(p0r+posB) = scale*f7r;
			*(p0r+posBi) = scale*f7i;

			p0r -= Nrems2;
			f0r = *(p0r);
			f0i = *(p0r+1);
			f1r = *(p0r+posA);
			f1i = *(p0r+posAi);
			iCol -= 1;
			p1r = IOP + BRLow[iCol]*4;
		};
		f2r = *(p0r+2);
		f2i = *(p0r+(2+1));
		f3r = *(p0r+posB);
		f3i = *(p0r+posBi);

		t0r   = f0r + f1r;
		t0i   = f0i + f1i;
		f1r = f0r - f1r;
		f1i = f0i - f1i;
		t1r   = f2r + f3r;
		t1i   = f2i + f3i;
		f3r = f2r - f3r;
		f3i = f2i - f3i;

		*(p0r) = scale*t0r;
		*(p0r+1) = scale*t0i;
		*(p0r+2) = scale*f1r;
		*(p0r+(2+1)) = scale*f1i;
		*(p0r+posA) = scale*t1r;
		*(p0r+posAi) = scale*t1i;
		*(p0r+posB) = scale*f3r;
		*(p0r+posBi) = scale*f3i;

	};
};
}